

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

double fcssx(double *b,int pq,void *params)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  void *__ptr;
  void *__ptr_00;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  void *pvVar22;
  ulong uVar23;
  double *pdVar24;
  uint uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  
  uVar19 = *params;
  lVar14 = (long)(int)uVar19;
  iVar17 = *(int *)((long)params + 0xc);
  lVar10 = (long)iVar17;
  uVar21 = *(uint *)((long)params + 0x10);
  uVar1 = *(uint *)((long)params + 0x18);
  uVar13 = uVar21 * iVar17 + uVar19;
  uVar2 = *(uint *)((long)params + 8);
  lVar20 = (long)(int)uVar2;
  uVar25 = uVar1 * iVar17 + uVar2;
  uVar3 = *(uint *)((long)params + 0x28);
  iVar4 = *(int *)((long)params + 0x58);
  uVar5 = *(uint *)((long)params + 0x2c);
  iVar6 = uVar2 + uVar19 + uVar21;
  lVar7 = (long)(int)uVar13;
  __ptr = malloc(lVar7 * 8);
  __ptr_00 = malloc((long)(int)uVar25 * 8);
  uVar8 = 0;
  uVar15 = 0;
  if (0 < (int)uVar19) {
    uVar15 = (ulong)uVar19;
  }
  for (; lVar11 = lVar14, uVar15 != uVar8; uVar8 = uVar8 + 1) {
    *(double *)((long)__ptr + uVar8 * 8) = b[uVar8];
  }
  for (; lVar11 < lVar7; lVar11 = lVar11 + 1) {
    *(undefined8 *)((long)__ptr + lVar11 * 8) = 0;
  }
  uVar16 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  for (; uVar8 != uVar16; uVar16 = uVar16 + 1) {
    *(double *)((long)__ptr_00 + uVar16 * 8) = b[lVar14 + uVar16];
  }
  for (; lVar20 < (int)uVar25; lVar20 = lVar20 + 1) {
    *(undefined8 *)((long)__ptr_00 + lVar20 * 8) = 0;
  }
  uVar18 = 0;
  uVar16 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    uVar16 = uVar18;
  }
  pvVar22 = (void *)((long)__ptr + lVar10 * 8);
  while (uVar18 != uVar16) {
    dVar26 = b[(long)(int)(uVar2 + uVar19) + uVar18];
    uVar18 = uVar18 + 1;
    *(double *)((long)__ptr + uVar18 * lVar10 * 8 + -8) =
         *(double *)((long)__ptr + uVar18 * lVar10 * 8 + -8) + dVar26;
    for (uVar23 = 0; uVar15 != uVar23; uVar23 = uVar23 + 1) {
      *(double *)((long)pvVar22 + uVar23 * 8) =
           *(double *)((long)pvVar22 + uVar23 * 8) - b[uVar23] * dVar26;
    }
    pvVar22 = (void *)((long)pvVar22 + lVar10 * 8);
  }
  uVar16 = 0;
  uVar15 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar15 = uVar16;
  }
  pvVar22 = (void *)((long)__ptr_00 + lVar10 * 8);
  while (uVar16 != uVar15) {
    dVar26 = b[(long)iVar6 + uVar16];
    uVar16 = uVar16 + 1;
    *(double *)((long)__ptr_00 + uVar16 * lVar10 * 8 + -8) =
         *(double *)((long)__ptr_00 + uVar16 * lVar10 * 8 + -8) + dVar26;
    for (uVar18 = 0; uVar8 != uVar18; uVar18 = uVar18 + 1) {
      *(double *)((long)pvVar22 + uVar18 * 8) =
           b[lVar14 + uVar18] * dVar26 + *(double *)((long)pvVar22 + uVar18 * 8);
    }
    pvVar22 = (void *)((long)pvVar22 + lVar10 * 8);
  }
  iVar9 = uVar3 + iVar4;
  uVar8 = 0;
  if ((int)uVar13 < 1) {
    uVar13 = 0;
  }
  for (; uVar13 != uVar8; uVar8 = uVar8 + 1) {
    *(undefined8 *)((long)params + uVar8 * 8 + (long)iVar9 * 8 + 0x60) = 0;
  }
  if (0 < (int)uVar5) {
    pdVar12 = (double *)((long)params + (long)(int)(uVar3 * 3 + iVar4) * 8 + 0x60);
    uVar8 = 0;
    uVar15 = 0;
    if (0 < (int)uVar3) {
      uVar15 = (ulong)uVar3;
    }
    for (; uVar8 != uVar15; uVar8 = uVar8 + 1) {
      dVar26 = *(double *)((long)params + (uVar8 + (long)(int)(iVar4 + uVar3 * 2)) * 8 + 0x60);
      pdVar24 = pdVar12;
      for (uVar16 = 0; uVar5 != uVar16; uVar16 = uVar16 + 1) {
        dVar26 = dVar26 - *pdVar24 * b[(long)(int)(iVar6 + uVar1) + uVar16];
        pdVar24 = pdVar24 + (int)uVar3;
      }
      *(double *)((long)params + (uVar8 + (long)iVar4) * 8 + 0x60) = dVar26;
      pdVar12 = pdVar12 + 1;
    }
  }
  iVar17 = uVar19 + uVar21 * iVar17;
  lVar10 = ((ulong)(uint)(iVar17 + iVar4) << 0x20) + -0x100000000;
  lVar14 = ((ulong)(uint)(iVar17 + iVar9) << 0x20) + -0x100000000;
  dVar27 = 0.0;
  uVar19 = 0;
  dVar26 = 0.0;
  while( true ) {
    uVar21 = uVar25;
    if ((int)uVar19 < (int)uVar25) {
      uVar21 = uVar19;
    }
    if ((int)uVar21 < 1) {
      uVar21 = 0;
    }
    if ((int)uVar3 <= lVar7) break;
    dVar28 = *(double *)((long)params + (lVar7 + iVar4) * 8 + 0x60);
    lVar20 = lVar10;
    for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
      dVar28 = dVar28 - *(double *)((long)__ptr + uVar8 * 8) *
                        *(double *)((long)params + (lVar20 >> 0x1d) + 0x60);
      lVar20 = lVar20 + -0x100000000;
    }
    lVar20 = lVar14;
    for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
      dVar28 = dVar28 - *(double *)((long)__ptr_00 + uVar8 * 8) *
                        *(double *)((long)params + (lVar20 >> 0x1d) + 0x60);
      lVar20 = lVar20 + -0x100000000;
    }
    dVar27 = dVar27 + 1.0;
    uVar19 = uVar19 + 1;
    *(double *)((long)params + (lVar7 + iVar9) * 8 + 0x60) = dVar28;
    dVar26 = dVar26 + dVar28 * dVar28;
    lVar7 = lVar7 + 1;
    lVar10 = lVar10 + 0x100000000;
    lVar14 = lVar14 + 0x100000000;
  }
  *(double *)((long)params + 0x48) = dVar26;
  *(uint *)((long)params + 0x30) = uVar19;
  dVar26 = log(dVar26 / dVar27);
  *(double *)((long)params + 0x50) = dVar26 * 0.5;
  free(__ptr);
  free(__ptr_00);
  return dVar26 * 0.5;
}

Assistant:

double fcssx(double *b, int pq, void *params) {
	double value, ssq,temp;
	int p, q, ps, qs, s, d, D, offset,jm;
	int ip, iq, i, j, N,iter,ncond,M,naram;
	double *phi, *theta,*reg;

	value = ssq =  0.0;
	
	xlik_css_object obj = (xlik_css_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);

	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	s = obj->s;
	M = obj->M;
	d = obj->d;
	D = obj->D;

	offset = obj->offset;
	ncond = p + s* ps;
	naram = p + q + ps + qs;

	//ncond = ncond + ncond1;

	reg = &obj->x[offset+3*N];

	//printf("\n %d %d %d \n", s,ps, qs);

	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);



	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	//mdisplay(theta, 1, q + s*qs);
	//mdisplay(b, 1, p + q + ps + qs);
	for (i = 0; i < ncond; ++i) {
		obj->x[offset+N + i] = 0.0;
	}


	if (obj->M > 0) {
		for (i = 0; i < N; ++i) {
			temp = obj->x[offset + 2 * N + i];
			for(j = 0; j < M;++j) {
				temp -= reg[j*N+i]*b[naram+j];
			}
			obj->x[offset + i] = temp;
		}
	}
	iter = 0;
	ssq = 0.0;
	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[offset+i];

		for (j = 0; j < ip; ++j) {
			temp = temp - phi[j] * obj->x[offset + i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[offset+N + i - j - 1];
		}

		obj->x[offset+N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	obj->Nmncond = iter;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	free(phi);
	free(theta);
	return value;
}